

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

__ssize_t __thiscall
httplib::detail::stream_line_reader::getline
          (stream_line_reader *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  int iVar1;
  int extraout_var;
  int extraout_var_00;
  undefined7 uVar4;
  ulong uVar3;
  long lVar5;
  char byte;
  char local_19;
  long lVar2;
  
  uVar3 = 0;
  this->fixed_buffer_used_size_ = 0;
  (this->glowable_buffer_)._M_string_length = 0;
  *(this->glowable_buffer_)._M_dataplus._M_p = '\0';
  iVar1 = (*this->strm_->_vptr_Stream[4])(this->strm_,&local_19,1);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (-1 < extraout_var) {
    lVar5 = 0;
    do {
      uVar4 = (undefined7)((ulong)&local_19 >> 8);
      if (lVar2 == 0) {
        uVar3 = CONCAT71(uVar4,lVar5 != 0);
        goto LAB_00114751;
      }
      append(this,local_19);
      if (local_19 == '\n') {
        uVar3 = CONCAT71(uVar4,1);
        goto LAB_00114751;
      }
      iVar1 = (*this->strm_->_vptr_Stream[4])(this->strm_,&local_19,1);
      lVar2 = CONCAT44(extraout_var_00,iVar1);
      lVar5 = lVar5 + -1;
    } while (-1 < extraout_var_00);
    uVar3 = 0;
  }
LAB_00114751:
  return uVar3 & 0xffffffff;
}

Assistant:

bool getline() {
				fixed_buffer_used_size_ = 0;
				glowable_buffer_.clear();

				for (size_t i = 0;; i++) {
					char byte;
					auto n = strm_.read(&byte, 1);

					if (n < 0) {
						return false;
					} else if (n == 0) {
						if (i == 0) {
							return false;
						} else {
							break;
						}
					}

					append(byte);

					if (byte == '\n') { break; }
				}

				return true;
			}